

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O0

S2Point * S2::GetVNorm(S2Point *__return_storage_ptr__,int face,double v)

{
  double v_local;
  int face_local;
  
  switch(face) {
  case 0:
    Vector3<double>::Vector3(__return_storage_ptr__,-v,0.0,1.0);
    break;
  case 1:
    Vector3<double>::Vector3(__return_storage_ptr__,0.0,-v,1.0);
    break;
  case 2:
    Vector3<double>::Vector3(__return_storage_ptr__,0.0,-1.0,-v);
    break;
  case 3:
    Vector3<double>::Vector3(__return_storage_ptr__,v,-1.0,0.0);
    break;
  case 4:
    Vector3<double>::Vector3(__return_storage_ptr__,1.0,v,0.0);
    break;
  default:
    Vector3<double>::Vector3(__return_storage_ptr__,1.0,0.0,v);
  }
  return __return_storage_ptr__;
}

Assistant:

inline S2Point GetVNorm(int face, double v) {
  switch (face) {
    case 0:  return S2Point(-v,  0,  1);
    case 1:  return S2Point( 0, -v,  1);
    case 2:  return S2Point( 0, -1, -v);
    case 3:  return S2Point( v, -1,  0);
    case 4:  return S2Point( 1,  v,  0);
    default: return S2Point( 1,  0,  v);
  }
}